

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O2

int GetLatestHokuyoMessageHokuyo(HOKUYO *pHokuyo,char *databuf,int databuflen,int *pNbdatabytes)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  size_t __n;
  char *pcVar11;
  ulong uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  double dVar16;
  int Bytes;
  int len;
  int local_609c;
  char *ptr;
  int *local_6090;
  char *local_6088;
  CHRONO chrono;
  char savebuf [8192];
  char recvbuf [16384];
  
  Bytes = 0;
  ptr = (char *)0x0;
  len = 0;
  StartChrono(&chrono);
  memset(recvbuf,0,0x4000);
  memset(savebuf,0,0x2000);
  iVar8 = ReadRS232Port(&pHokuyo->RS232Port,(uint8 *)recvbuf,0x1fff,&Bytes);
  if (iVar8 == 0) {
    iVar8 = Bytes;
    local_609c = databuflen;
    local_6090 = pNbdatabytes;
    local_6088 = databuf;
    if (Bytes < 0x1fff) {
LAB_001241bb:
      while (iVar9 = FindLatestHokuyoMessage(recvbuf,iVar8,&ptr,&len), pcVar11 = local_6088,
            iVar10 = local_609c, iVar9 != 0) {
        dVar16 = GetTimeElapsedChronoQuick(&chrono);
        if (4.0 < dVar16) {
LAB_00124238:
          puts("Error reading data from a Hokuyo : Message timeout. ");
          return 2;
        }
        if (0x3ffe < iVar8) {
          puts("Error reading data from a Hokuyo : Invalid data. ");
          return 4;
        }
        iVar10 = ReadRS232Port(&pHokuyo->RS232Port,(uint8 *)(recvbuf + iVar8),0x3fff - iVar8,&Bytes)
        ;
        if (iVar10 != 0) goto LAB_001240d2;
        iVar8 = iVar8 + Bytes;
      }
      memset(local_6088,0,(long)local_609c);
      uVar14 = 0;
      do {
        if ((ptr[uVar14 + 0x19] == '\n') && (ptr[uVar14 + 0x1a] == '\n')) {
          iVar8 = (int)uVar14;
          len = iVar8 + 0x1b;
          iVar9 = (int)((uVar14 & 0xffffffff) / 0x42) * -0x42;
          iVar13 = iVar9 + iVar8;
          uVar12 = ((long)iVar9 + uVar14) - 2;
          iVar9 = (int)uVar12;
          if (iVar13 < 3) {
            iVar9 = 0;
          }
          iVar9 = iVar9 + (int)((long)((ulong)(uint)(iVar8 >> 0x1f) << 0x20 | uVar14 & 0xffffffff) /
                               0x42) * 0x40;
          *local_6090 = iVar9;
          if (iVar9 <= iVar10) {
            if (iVar9 < 1) {
              return 0;
            }
            for (lVar15 = 0; (int)(uVar14 / 0x42) * 0x42 != (int)lVar15; lVar15 = lVar15 + 0x42) {
              uVar1 = *(undefined8 *)(ptr + lVar15 + 0x1a);
              uVar2 = *(undefined8 *)(ptr + lVar15 + 0x1a + 8);
              uVar3 = *(undefined8 *)(ptr + lVar15 + 0x2a);
              uVar4 = *(undefined8 *)(ptr + lVar15 + 0x2a + 8);
              uVar5 = *(undefined8 *)(ptr + lVar15 + 0x3a);
              uVar6 = *(undefined8 *)(ptr + lVar15 + 0x3a + 8);
              uVar7 = *(undefined8 *)(ptr + lVar15 + 0x4a + 8);
              *(undefined8 *)(pcVar11 + 0x30) = *(undefined8 *)(ptr + lVar15 + 0x4a);
              *(undefined8 *)(pcVar11 + 0x38) = uVar7;
              *(undefined8 *)(pcVar11 + 0x20) = uVar5;
              *(undefined8 *)(pcVar11 + 0x28) = uVar6;
              *(undefined8 *)(pcVar11 + 0x10) = uVar3;
              *(undefined8 *)(pcVar11 + 0x18) = uVar4;
              *(undefined8 *)pcVar11 = uVar1;
              *(undefined8 *)(pcVar11 + 8) = uVar2;
              pcVar11 = pcVar11 + 0x40;
            }
            if (iVar13 < 3) {
              return 0;
            }
            memcpy(pcVar11,ptr + lVar15 + 0x1a,uVar12 & 0xffffffff);
            return 0;
          }
          pcVar11 = "Too small data buffer.";
          goto LAB_001240d9;
        }
        lVar15 = uVar14 + 0x1a;
        uVar14 = uVar14 + 1;
      } while (lVar15 < (long)len + -1);
    }
    else {
      do {
        iVar8 = Bytes;
        if (Bytes != 0x1fff) {
          __n = (size_t)Bytes;
          memmove(recvbuf + (0x1fff - __n),recvbuf,__n);
          memcpy(recvbuf,savebuf + __n,(long)(0x1fff - iVar8));
          iVar8 = 0x1fff;
          goto LAB_001241bb;
        }
        dVar16 = GetTimeElapsedChronoQuick(&chrono);
        if (4.0 < dVar16) goto LAB_00124238;
        memcpy(savebuf,recvbuf,(long)Bytes);
        iVar8 = ReadRS232Port(&pHokuyo->RS232Port,(uint8 *)recvbuf,0x1fff,&Bytes);
      } while (iVar8 == 0);
    }
  }
LAB_001240d2:
  pcVar11 = "Error reading data from a Hokuyo. ";
LAB_001240d9:
  puts(pcVar11);
  return 1;
}

Assistant:

inline int GetLatestHokuyoMessageHokuyo(HOKUYO* pHokuyo, char* databuf, int databuflen, int* pNbdatabytes)
{
	char recvbuf[2*MAX_NB_BYTES_HOKUYO];
	char savebuf[MAX_NB_BYTES_HOKUYO];
	int BytesReceived = 0, Bytes = 0, recvbuflen = 0;
	char* ptr = NULL;
	int len = 0;
	int i = 0, j = 0, k = 0, nbFullDataBlocks = 0, PartialDataBlockLen = 0;
	CHRONO chrono;

	StartChrono(&chrono);

	// Prepare the buffers.
	memset(recvbuf, 0, sizeof(recvbuf));
	memset(savebuf, 0, sizeof(savebuf));
	recvbuflen = MAX_NB_BYTES_HOKUYO-1; // The last character must be a 0 to be a valid string for sscanf.
	BytesReceived = 0;

	if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
	{
		printf("Error reading data from a Hokuyo. \n");
		return EXIT_FAILURE;
	}
	BytesReceived += Bytes;

	if (BytesReceived >= recvbuflen)
	{
		// If the buffer is full and if the device always sends data, there might be old data to discard...

		while (Bytes == recvbuflen)
		{
			if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_HOKUYO)
			{
				printf("Error reading data from a Hokuyo : Message timeout. \n");
				return EXIT_TIMEOUT;
			}
			memcpy(savebuf, recvbuf, Bytes);
			if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf, recvbuflen, &Bytes) != EXIT_SUCCESS)
			{
				printf("Error reading data from a Hokuyo. \n");
				return EXIT_FAILURE;
			}
			BytesReceived += Bytes;
		}

		// The desired message should be among all the data gathered, unless there was 
		// so many other messages sent after that the desired message was in the 
		// discarded data, or we did not wait enough...

		memmove(recvbuf+recvbuflen-Bytes, recvbuf, Bytes);
		memcpy(recvbuf, savebuf+Bytes, recvbuflen-Bytes);

		// Only the last recvbuflen bytes received should be taken into account in what follows.
		BytesReceived = recvbuflen;
	}

	// The data need to be analyzed and we must check if we need to get more data from 
	// the device to get the desired message.
	// But normally we should not have to get more data unless we did not wait enough
	// for the desired message...

	while (FindLatestHokuyoMessage(recvbuf, BytesReceived, &ptr, &len) != EXIT_SUCCESS)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > TIMEOUT_MESSAGE_HOKUYO)
		{
			printf("Error reading data from a Hokuyo : Message timeout. \n");
			return EXIT_TIMEOUT;
		}
		// The last character must be a 0 to be a valid string for sscanf.
		if (BytesReceived >= 2*MAX_NB_BYTES_HOKUYO-1)
		{
			printf("Error reading data from a Hokuyo : Invalid data. \n");
			return EXIT_INVALID_DATA;
		}
		if (ReadRS232Port(&pHokuyo->RS232Port, (unsigned char*)recvbuf+BytesReceived, 2*MAX_NB_BYTES_HOKUYO-1-BytesReceived, &Bytes) != EXIT_SUCCESS)
		{
			printf("Error reading data from a Hokuyo. \n");
			return EXIT_FAILURE;
		}
		BytesReceived += Bytes;
	}

	// Get data bytes.
	memset(databuf, 0, databuflen);
		
	// MD response...
	// "MD%04d%04d%02d%01d%02d\n99b\n%04d%01d\n  %01d\n    %01d\n\n" ..., &RemainingScans, &TimeStamp, &sum

	i = 25;
	for (;;)
	{
		if ((ptr[i] == '\n')&&(ptr[i+1] == '\n')) break;
		i++;
		if (i >= len-1) 
		{
			printf("Error reading data from a Hokuyo. \n");
			return EXIT_FAILURE;
		}
	}

	len = i+2;

	nbFullDataBlocks = (len-27)/66;
	PartialDataBlockLen = (len-27)%66-2;

	// If PartialDataBlockLen <= 0, no partial block, only full of 64 bytes.
	*pNbdatabytes = (PartialDataBlockLen <= 0)? 64*nbFullDataBlocks: 64*nbFullDataBlocks+PartialDataBlockLen;

	// Check the number of data bytes before copy.
	if (databuflen < *pNbdatabytes)
	{
		printf("Too small data buffer.\n");
		return EXIT_FAILURE;
	}

	// Copy the data bytes of the message.
	if (*pNbdatabytes > 0)
	{
		j = 0;
		i = 26;
		for (k = 0; k < nbFullDataBlocks; k++)
		{
			memcpy(databuf+j, ptr+i, 64);
			j += 64;
			i += 66;
		}
		if (PartialDataBlockLen > 0) memcpy(databuf+j, ptr+i, PartialDataBlockLen);
	}

	return EXIT_SUCCESS;
}